

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

int tnt_object_verify(tnt_stream *obj,int8_t type)

{
  int iVar1;
  byte *end_00;
  char *end;
  char *pos;
  tnt_stream *ptStack_18;
  int8_t type_local;
  tnt_stream *obj_local;
  
  end = *obj->data;
  end_00 = (byte *)end + *(long *)((long)obj->data + 8);
  if ((type < '\0') || (obj_local._7_1_ = *end, mp_type_hint[obj_local._7_1_] == (uint)(byte)type))
  {
    pos._7_1_ = type;
    ptStack_18 = obj;
    iVar1 = mp_check(&end,(char *)end_00);
    if (iVar1 == 0) {
      if (end < end_00) {
        obj_local._0_4_ = -1;
      }
      else {
        obj_local._0_4_ = 0;
      }
    }
    else {
      obj_local._0_4_ = -1;
    }
  }
  else {
    obj_local._0_4_ = -1;
  }
  return (int)obj_local;
}

Assistant:

int tnt_object_verify(struct tnt_stream *obj, int8_t type)
{
	const char *pos = TNT_SBUF_DATA(obj);
	const char *end = pos + TNT_SBUF_SIZE(obj);
	if (type >= 0 && mp_typeof(*pos) != (uint8_t) type) return -1;
	if (mp_check(&pos, end)) return -1;
	if (pos < end) return -1;
	return 0;
}